

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall
ON_MeshCurvatureStats::Set
          (ON_MeshCurvatureStats *this,curvature_style kappa_style,int Kcount,ON_SurfaceCurvature *K
          ,ON_3fVector *N,double infinity)

{
  ON_Interval *pOVar1;
  int iVar2;
  double *a;
  ON_Interval *pOVar3;
  uint uVar4;
  ON_Interval *this_00;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ON_Workspace ws;
  ON_Workspace local_58;
  double local_48;
  undefined8 uStack_40;
  
  this->m_style = unknown_curvature_style;
  this_00 = &this->m_range;
  this->m_infinity = 0.0;
  this->m_count_infinite = 0;
  this->m_count = 0;
  this->m_mode = 0.0;
  this->m_average = 0.0;
  this->m_adev = 0.0;
  ON_Interval::Set(this_00,0.0,0.0);
  if (K == (ON_SurfaceCurvature *)0x0 || Kcount < 1) {
    return false;
  }
  ON_Workspace::ON_Workspace(&local_58);
  uVar5 = (ulong)(uint)Kcount;
  a = ON_Workspace::GetDoubleMemory(&local_58,uVar5);
  uVar4 = kappa_style - gaussian_curvature;
  bVar6 = uVar4 < 4;
  if (bVar6) {
    this->m_style = kappa_style;
    this->m_infinity =
         (double)(-(ulong)(0.0 < infinity) & (ulong)infinity |
                 ~-(ulong)(0.0 < infinity) & *(ulong *)(&DAT_006c4de0 + (ulong)uVar4 * 8));
  }
  dVar8 = ON_DBL_QNAN;
  local_48 = 1e+300;
  uStack_40 = 0;
  pOVar1 = (ON_Interval *)((this->m_range).m_t + 1);
  do {
    dVar11 = dVar8;
    switch(uVar4) {
    case 0:
      if ((ABS(K->k1) < 1.23432101234321e+308) && (ABS(K->k2) < 1.23432101234321e+308)) {
        dVar11 = K->k1 * K->k2;
      }
      goto LAB_004fe6af;
    case 1:
      dVar9 = K->k1;
      if ((ABS(dVar9) < 1.23432101234321e+308) &&
         (dVar10 = K->k2, ABS(dVar10) < 1.23432101234321e+308)) {
        if ((dVar9 != dVar10) || (dVar11 = dVar9, NAN(dVar9) || NAN(dVar10))) {
          dVar11 = (dVar9 + dVar10) * 0.5;
        }
      }
      break;
    case 2:
      dVar9 = ABS(K->k1);
      if ((dVar9 < 1.23432101234321e+308) && (dVar10 = ABS(K->k2), dVar10 < 1.23432101234321e+308))
      {
        dVar11 = (double)(~-(ulong)(dVar10 <= dVar9) & (ulong)dVar10 |
                         -(ulong)(dVar10 <= dVar9) & (ulong)dVar9);
        uVar7 = -(ulong)(1e-300 < dVar11);
        dVar11 = (double)(~uVar7 & (ulong)local_48 | (ulong)(1.0 / dVar11) & uVar7);
      }
      break;
    case 3:
      dVar11 = ON_SurfaceCurvature::MaximumRadius(K);
      break;
    default:
      dVar11 = 0.0;
      goto LAB_004fe6af;
    }
    dVar11 = ABS(dVar11);
LAB_004fe6af:
    if (this->m_infinity <= ABS(dVar11)) {
      this->m_count_infinite = this->m_count_infinite + 1;
    }
    else {
      iVar2 = this->m_count;
      pOVar3 = this_00;
      if ((long)iVar2 == 0) {
        pOVar1->m_t[0] = dVar11;
LAB_004fe6f7:
        pOVar3->m_t[0] = dVar11;
      }
      else if ((dVar11 < this_00->m_t[0]) ||
              (pOVar3 = pOVar1, pOVar1->m_t[0] <= dVar11 && dVar11 != pOVar1->m_t[0]))
      goto LAB_004fe6f7;
      this->m_count = iVar2 + 1;
      a[iVar2] = dVar11;
    }
    K = K + 1;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
  if ((long)this->m_count == 0) {
    bVar6 = false;
    goto LAB_004fe7fc;
  }
  ON_SortDoubleArray(quick_sort,a,(long)this->m_count);
  uVar4 = this->m_count;
  dVar8 = a[(int)uVar4 / 2];
  this->m_mode = dVar8;
  if ((uVar4 & 1) == 0) {
    this->m_mode = (dVar8 + a[(long)((int)uVar4 >> 1) + -1]) * 0.5;
  }
  dVar8 = this->m_average;
  if ((int)uVar4 < 1) {
    this->m_average = dVar8 / (double)(int)uVar4;
LAB_004fe7ea:
    dVar11 = this->m_adev;
  }
  else {
    uVar5 = 0;
    do {
      dVar8 = dVar8 + a[uVar5];
      this->m_average = dVar8;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    this->m_average = dVar8 / (double)(int)uVar4;
    if ((int)uVar4 < 1) goto LAB_004fe7ea;
    dVar11 = this->m_adev;
    uVar5 = 0;
    do {
      dVar11 = dVar11 + ABS(a[uVar5] - dVar8 / (double)(int)uVar4);
      this->m_adev = dVar11;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  this->m_adev = dVar11 / (double)(int)uVar4;
LAB_004fe7fc:
  ON_Workspace::~ON_Workspace(&local_58);
  return bVar6;
}

Assistant:

bool ON_MeshCurvatureStats::Set( ON::curvature_style kappa_style,
                                 int Kcount,
                                 const ON_SurfaceCurvature* K,
                                 const ON_3fVector* N, // needed for normal sectional curvatures
                                 double infinity
                                 )
{
  bool rc = (Kcount > 0 && K != nullptr);

  Destroy();

  if (rc) {
    ON_Workspace ws;
    //ON_3dVector tangent;
    double k;
    double* kappa = ws.GetDoubleMemory(Kcount);
    int i;

    switch( kappa_style ) {
    case ON::gaussian_curvature:
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e20;
      break;
    case ON::mean_curvature: // unsigned mean
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      m_style = kappa_style;
      m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
      break;
    //case ON::section_curvature_x:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    //case ON::section_curvature_y:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    //case ON::section_curvature_z:
    //  if ( !N )
    //    kappa_style = ON::unknown_curvature_style;
    //  m_style = kappa_style;
    //  m_infinity = ( infinity > 0.0 ) ? infinity : 1.0e10;
    //  break;
    default:
      rc = false;
      break;
    }

    for ( i = 0; i < Kcount; i++ ) {
      switch( kappa_style ) {
      case ON::gaussian_curvature:
        k = K[i].GaussianCurvature();
        break;
      case ON::mean_curvature: // unsigned mean
        k = fabs(K[i].MeanCurvature());
        break;
      case ON::min_curvature: // minimum unsigned radius of curvature
        k = fabs(K[i].MinimumRadius());
        break;
      case ON::max_curvature: // maximum unsigned radius of curvature
        k = fabs(K[i].MaximumRadius());
        break;
      //case ON::section_curvature_x:
      //  tangent.x = 0.0; tangent.y = -N[i].z; tangent.z = N[i].y;
      //  if ( fabs(tangent.y) <= ON_SQRT_EPSILON && fabs(tangent.z) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      //case ON::section_curvature_y:
      //  tangent.x = N[i].z; tangent.y = 0.0; tangent.z = -N[i].x;
      //  if ( fabs(tangent.x) <= ON_SQRT_EPSILON && fabs(tangent.z) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      //case ON::section_curvature_z:
      //  tangent.x = -N[i].y; tangent.y = N[i].x; tangent.z = 0.0;
      //  if ( fabs(tangent.x) <= ON_SQRT_EPSILON && fabs(tangent.y) <= ON_SQRT_EPSILON )
      //    tangent.Zero();
      //  else
      //    tangent.Unitize();
      //  k = fabs(K[i].NormalCurvature(tangent));
      //  break;
      default:
        k=0.0;
        break;
      }
      if ( fabs(k) >= m_infinity ) {
        m_count_infinite++;
        continue;
      }
      if ( m_count ) {
        if ( k < m_range.m_t[0] )
          m_range.m_t[0] = k;
        else if ( k > m_range.m_t[1] )
          m_range.m_t[1] = k;
      }
      else {
        m_range.m_t[0] = m_range.m_t[1] = k;
      }
      kappa[m_count++] = k;
    }


    if ( m_count == 0 )
      rc = false;
    else {
      // sum curvatures
      ON_SortDoubleArray( ON::sort_algorithm::quick_sort, kappa, m_count );

      // mode
      m_mode = kappa[m_count/2];
      if ( 0 == (m_count % 2) ) {
        m_mode += kappa[(m_count/2)-1];
        m_mode *= 0.5;
      }

      // average
      for ( i = 0; i < m_count; i++ ) {
        m_average += kappa[i];
      }
      m_average = m_average/m_count;
      
      // average deviation
      for ( i = 0; i < m_count; i++ ) {
        m_adev += fabs(kappa[i] - m_average);
      }
      m_adev = m_adev/m_count;
    }  
  }
  
  return rc;  
}